

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::MergeLayerEdges
          (S2Builder *this,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids,
          vector<int,_std::allocator<int>_> *edge_layers)

{
  pointer pvVar1;
  iterator __position;
  iterator iVar2;
  long lVar3;
  pair<int,_int> pVar4;
  iterator iVar5;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  vector<int,std::allocator<int>> *this_01;
  vector<int,std::allocator<int>> *this_02;
  pair<int,_int> *__args;
  int *__args_00;
  ulong uVar6;
  long lVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __i;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __last;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var8;
  ulong uVar9;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> order;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_78;
  iterator iStack_70;
  pair<int,_int> *local_68;
  pair<int,_int> local_58;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<int,std::allocator<int>> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  local_78._M_current = (pair<int,_int> *)0x0;
  iStack_70._M_current = (pair<int,_int> *)0x0;
  local_68 = (pair<int,_int> *)0x0;
  local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges;
  local_48 = (vector<int,std::allocator<int>> *)input_edge_ids;
  local_40 = (vector<int,std::allocator<int>> *)edge_layers;
  local_38 = layer_input_edge_ids;
  if ((layer_edges->
      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (layer_edges->
      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      pvVar1 = (layer_edges->
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar6].
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data + 8) !=
          pvVar1[uVar6].
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar9 = 0;
        do {
          local_58.first = (int)uVar6;
          local_58.second = (int)uVar9;
          if (iStack_70._M_current == local_68) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            _M_realloc_insert<std::pair<int,int>>
                      ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_78,
                       iStack_70,&local_58);
          }
          else {
            pVar4.second = local_58.second;
            pVar4.first = local_58.first;
            *iStack_70._M_current = pVar4;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
          uVar9 = uVar9 + 1;
          pvVar1 = (layer_edges->
                   super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar6].
                                                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                                ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar6].
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data >> 3));
      }
      uVar6 = uVar6 + 1;
      uVar9 = ((long)(layer_edges->
                     super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(layer_edges->
                     super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
  }
  this_00 = local_50;
  iVar5._M_current = iStack_70._M_current;
  _Var8._M_current = local_78._M_current;
  if (local_78._M_current != iStack_70._M_current) {
    lVar7 = (long)iStack_70._M_current - (long)local_78._M_current;
    uVar6 = lVar7 >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
              (local_78,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         )iStack_70._M_current,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                )layer_edges);
    if (lVar7 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                (_Var8,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        )iVar5._M_current,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                  )layer_edges);
    }
    else {
      __last._M_current = _Var8._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                (_Var8,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                  )layer_edges);
      for (; __last._M_current != iVar5._M_current; __last._M_current = __last._M_current + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<S2Builder::MergeLayerEdges(std::vector<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>,std::allocator<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>const&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>*,std::vector<int,std::allocator<int>>*,std::vector<int,std::allocator<int>>*)const::__0>>
                  (__last,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_figroc[P]s2geometry_src_s2_s2builder_cc:1334:5)>
                           )layer_edges);
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,
             (long)iStack_70._M_current - (long)local_78._M_current >> 3);
  this_02 = local_40;
  this_01 = local_48;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_48,
             (long)iStack_70._M_current - (long)local_78._M_current >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)this_02,
             (long)iStack_70._M_current - (long)local_78._M_current >> 3);
  iVar5._M_current = iStack_70._M_current;
  for (_Var8._M_current = local_78._M_current; _Var8._M_current != iVar5._M_current;
      _Var8._M_current = _Var8._M_current + 1) {
    __args = (pair<int,_int> *)
             ((long)(_Var8._M_current)->second * 8 +
             *(long *)&(layer_edges->
                       super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[(_Var8._M_current)->first].
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data);
    __position._M_current = *(pair<int,_int> **)(this_00 + 8);
    if (__position._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      _M_realloc_insert<std::pair<int,int>const&>(this_00,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    __args_00 = (int *)((long)(_Var8._M_current)->second * 4 +
                       *(long *)&(local_38->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [(_Var8._M_current)->first].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data);
    iVar2._M_current = *(int **)(this_01 + 8);
    if (iVar2._M_current == *(int **)(this_01 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_01,iVar2,__args_00);
    }
    else {
      *iVar2._M_current = *__args_00;
      *(int **)(this_01 + 8) = iVar2._M_current + 1;
    }
    iVar2._M_current = *(int **)(this_02 + 8);
    if (iVar2._M_current == *(int **)(this_02 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                (this_02,iVar2,&(_Var8._M_current)->first);
    }
    else {
      *iVar2._M_current = (_Var8._M_current)->first;
      *(int **)(this_02 + 8) = iVar2._M_current + 1;
    }
  }
  if (local_78._M_current != (pair<int,_int> *)0x0) {
    operator_delete(local_78._M_current);
  }
  return;
}

Assistant:

void S2Builder::MergeLayerEdges(
    const vector<vector<Edge>>& layer_edges,
    const vector<vector<InputEdgeIdSetId>>& layer_input_edge_ids,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids,
    vector<int>* edge_layers) const {
  vector<LayerEdgeId> order;
  for (int i = 0; i < layer_edges.size(); ++i) {
    for (int e = 0; e < layer_edges[i].size(); ++e) {
      order.push_back(LayerEdgeId(i, e));
    }
  }
  std::sort(order.begin(), order.end(),
    [&layer_edges](const LayerEdgeId& ai, const LayerEdgeId& bi) {
         return StableLessThan(layer_edges[ai.first][ai.second],
                               layer_edges[bi.first][bi.second], ai, bi);
            });
  edges->reserve(order.size());
  input_edge_ids->reserve(order.size());
  edge_layers->reserve(order.size());
  for (const LayerEdgeId& id : order) {
    edges->push_back(layer_edges[id.first][id.second]);
    input_edge_ids->push_back(layer_input_edge_ids[id.first][id.second]);
    edge_layers->push_back(id.first);
  }
}